

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O1

void init_displaychars(void)

{
  char cVar1;
  wchar_t wVar2;
  int iVar3;
  curses_drawing_info *pcVar4;
  nh_bool nVar5;
  int iVar6;
  nh_drawing_info *orig;
  size_t sVar7;
  __off_t _Var8;
  char *pcVar9;
  char *pcVar10;
  ushort **ppuVar11;
  wchar_t *pwVar12;
  byte bVar13;
  byte *pbVar14;
  byte *pbVar15;
  long lVar16;
  curses_symdef_conflict *pcVar17;
  curses_symdef_conflict ovr;
  char symname [64];
  curses_symdef_conflict local_1a8;
  char local_178 [64];
  char local_138 [5];
  undefined8 auStack_133 [32];
  
  orig = (nh_drawing_info *)nh_get_drawing_info();
  default_drawing = load_nh_drawing_info(orig);
  unicode_drawing = load_nh_drawing_info(orig);
  rogue_drawing = load_nh_drawing_info(orig);
  apply_override(unicode_drawing,unicode_graphics_ovr,L'*','\0');
  apply_override(rogue_drawing,rogue_graphics_ovr,L'\n','\0');
  local_138[0] = '\0';
  nVar5 = get_gamedir(CONFIG_DIR,local_138);
  if (nVar5 != '\0') {
    sVar7 = strlen(local_138);
    builtin_strncpy(local_138 + sVar7,"unicode.",8);
    *(undefined8 *)((long)auStack_133 + sVar7) = 0x666e6f632e6564;
    iVar6 = open(local_138,0,0);
    if (iVar6 != -1) {
      _Var8 = lseek(iVar6,0,2);
      lseek(iVar6,0,0);
      iVar3 = (int)_Var8;
      pcVar9 = (char *)malloc((long)(iVar3 + 1));
      read(iVar6,pcVar9,(long)iVar3);
      pcVar9[iVar3] = '\0';
      close(iVar6);
      pcVar10 = strtok(pcVar9,"\r\n");
      if (pcVar10 != (char *)0x0) {
        do {
          if ((*pcVar10 == '!') && (pcVar10[1] == '\"')) {
            local_1a8.unichar[1] = L'\0';
            local_1a8.unichar[2] = L'\0';
            local_1a8.unichar[3] = L'\0';
            local_1a8.unichar[4] = L'\0';
            local_1a8.symname = (char *)0x0;
            local_1a8.color = 0;
            local_1a8.unichar[0] = L'\0';
            local_1a8.unichar[5] = L'\0';
            local_1a8.ch = 0;
            local_1a8.custom = '\0';
            local_1a8._39_1_ = 0;
            pbVar14 = (byte *)(pcVar10 + 3);
            for (sVar7 = 0; (cVar1 = (pcVar10 + 2)[sVar7], cVar1 != '\0' && (cVar1 != '\"'));
                sVar7 = sVar7 + 1) {
              pbVar14 = pbVar14 + 1;
            }
            strncpy(local_178,pcVar10 + 2,sVar7);
            local_178[sVar7] = '\0';
            local_1a8.symname = local_178;
            do {
              pbVar15 = pbVar14;
              bVar13 = *pbVar15;
              if ((ulong)bVar13 == 0) break;
              ppuVar11 = __ctype_b_loc();
              pbVar14 = pbVar15 + 1;
            } while ((*(byte *)((long)*ppuVar11 + (ulong)bVar13 * 2 + 1) & 0x20) != 0);
            __isoc99_sscanf(pbVar15,"%d",&local_1a8.color);
            bVar13 = *pbVar15;
            if (bVar13 != 0) {
              ppuVar11 = __ctype_b_loc();
              do {
                if ((*(byte *)((long)*ppuVar11 + (ulong)bVar13 * 2 + 1) & 0x20) != 0) break;
                bVar13 = pbVar15[1];
                pbVar15 = pbVar15 + 1;
              } while (bVar13 != 0);
            }
            __isoc99_sscanf(pbVar15,"%x",local_1a8.unichar);
            apply_override(unicode_drawing,&local_1a8,L'\x01','\x01');
          }
          pcVar10 = strtok((char *)0x0,"\r\n");
        } while (pcVar10 != (char *)0x0);
      }
      free(pcVar9);
    }
  }
  pcVar4 = default_drawing;
  cur_drawing = default_drawing;
  wVar2 = default_drawing->num_bgelements;
  if (0 < (long)wVar2) {
    pcVar17 = default_drawing->bgelements;
    lVar16 = 0;
    do {
      pcVar9 = pcVar17->symname;
      iVar6 = strcmp("altar",pcVar9);
      pwVar12 = &altar_id;
      if (iVar6 == 0) {
LAB_0011245a:
        *pwVar12 = (wchar_t)lVar16;
      }
      else {
        iVar6 = strcmp("vwall",pcVar9);
        pwVar12 = &vwall_id;
        if (iVar6 == 0) goto LAB_0011245a;
        iVar6 = strcmp("trwall",pcVar9);
        pwVar12 = &trwall_id;
        if (iVar6 == 0) goto LAB_0011245a;
        iVar6 = strcmp("room",pcVar9);
        pwVar12 = &room_id;
        if (iVar6 == 0) goto LAB_0011245a;
        iVar6 = strcmp("darkroom",pcVar9);
        pwVar12 = &darkroom_id;
        if (iVar6 == 0) goto LAB_0011245a;
        iVar6 = strcmp("ndoor",pcVar9);
        pwVar12 = &ndoor_id;
        if (iVar6 == 0) goto LAB_0011245a;
        iVar6 = strcmp("vcdoor",pcVar9);
        pwVar12 = &vcdoor_id;
        if (iVar6 == 0) goto LAB_0011245a;
        iVar6 = strcmp("hcdoor",pcVar9);
        pwVar12 = &hcdoor_id;
        if (iVar6 == 0) goto LAB_0011245a;
        iVar6 = strcmp("upstair",pcVar9);
        pwVar12 = &upstair_id;
        if (iVar6 == 0) goto LAB_0011245a;
        iVar6 = strcmp("upladder",pcVar9);
        pwVar12 = &upladder_id;
        if (iVar6 == 0) goto LAB_0011245a;
        iVar6 = strcmp("upsstair",pcVar9);
        pwVar12 = &upsstair_id;
        if (iVar6 == 0) goto LAB_0011245a;
        iVar6 = strcmp("dnstair",pcVar9);
        pwVar12 = &dnstair_id;
        if (iVar6 == 0) goto LAB_0011245a;
        iVar6 = strcmp("dnladder",pcVar9);
        pwVar12 = &dnladder_id;
        if (iVar6 == 0) goto LAB_0011245a;
        iVar6 = strcmp("dnsstair",pcVar9);
        pwVar12 = &dnsstair_id;
        if (iVar6 == 0) goto LAB_0011245a;
      }
      lVar16 = lVar16 + 1;
      pcVar17 = pcVar17 + 1;
    } while (wVar2 != lVar16);
  }
  wVar2 = pcVar4->num_traps;
  if (0 < (long)wVar2) {
    pcVar17 = pcVar4->traps;
    lVar16 = 0;
    do {
      pcVar9 = pcVar17->symname;
      iVar6 = strcmp("magic portal",pcVar9);
      pwVar12 = &mportal_id;
      if (iVar6 == 0) {
LAB_001124c4:
        *pwVar12 = (wchar_t)lVar16;
      }
      else {
        iVar6 = strcmp("vibrating square",pcVar9);
        pwVar12 = &vibsquare_id;
        if (iVar6 == 0) goto LAB_001124c4;
      }
      lVar16 = lVar16 + 1;
      pcVar17 = pcVar17 + 1;
    } while (wVar2 != lVar16);
  }
  wVar2 = pcVar4->num_objects;
  if (0 < (long)wVar2) {
    pcVar17 = pcVar4->objects;
    lVar16 = 0;
    do {
      iVar6 = strcmp("corpse",pcVar17->symname);
      if (iVar6 == 0) {
        corpse_id = (wchar_t)lVar16;
      }
      lVar16 = lVar16 + 1;
      pcVar17 = pcVar17 + 1;
    } while (wVar2 != lVar16);
  }
  switch_graphics(settings.graphics);
  return;
}

Assistant:

void init_displaychars(void)
{
    int i;
    struct nh_drawing_info *dinfo = nh_get_drawing_info();
    
    default_drawing = load_nh_drawing_info(dinfo);
    unicode_drawing = load_nh_drawing_info(dinfo);
    rogue_drawing = load_nh_drawing_info(dinfo);
    
    apply_override(unicode_drawing, unicode_graphics_ovr,
		   array_size(unicode_graphics_ovr), FALSE);
    apply_override(rogue_drawing, rogue_graphics_ovr, array_size(rogue_graphics_ovr), FALSE);
    
    read_unisym_config();
    
    cur_drawing = default_drawing;

    /* find bg elements that could use special treatment */
    for (i = 0; i < cur_drawing->num_bgelements; i++) {
	if (!strcmp("altar", cur_drawing->bgelements[i].symname))
	    altar_id = i;
	else if (!strcmp("vwall", cur_drawing->bgelements[i].symname))
	    vwall_id = i;
	else if (!strcmp("trwall", cur_drawing->bgelements[i].symname))
	    trwall_id = i;
	else if (!strcmp("room", cur_drawing->bgelements[i].symname))
	    room_id = i;
	else if (!strcmp("darkroom", cur_drawing->bgelements[i].symname))
	    darkroom_id = i;
	else if (!strcmp("ndoor", cur_drawing->bgelements[i].symname))
	    ndoor_id = i;
	else if (!strcmp("vcdoor", cur_drawing->bgelements[i].symname))
	    vcdoor_id = i;
	else if (!strcmp("hcdoor", cur_drawing->bgelements[i].symname))
	    hcdoor_id = i;
	else if (!strcmp("upstair", cur_drawing->bgelements[i].symname))
	    upstair_id = i;
	else if (!strcmp("upladder", cur_drawing->bgelements[i].symname))
	    upladder_id = i;
	else if (!strcmp("upsstair", cur_drawing->bgelements[i].symname))
	    upsstair_id = i;
	else if (!strcmp("dnstair", cur_drawing->bgelements[i].symname))
	    dnstair_id = i;
	else if (!strcmp("dnladder", cur_drawing->bgelements[i].symname))
	    dnladder_id = i;
	else if (!strcmp("dnsstair", cur_drawing->bgelements[i].symname))
	    dnsstair_id = i;
    }

    /* find traps that could use special treatment */
    for (i = 0; i < cur_drawing->num_traps; i++) {
	if (!strcmp("magic portal", cur_drawing->traps[i].symname))
	    mportal_id = i;
	else if (!strcmp("vibrating square", cur_drawing->traps[i].symname))
	    vibsquare_id = i;
    }

    /* find objects that could use special treatment */
    for (i = 0; i < cur_drawing->num_objects; i++) {
	if (!strcmp("corpse", cur_drawing->objects[i].symname))
	    corpse_id = i;
    }

    /* options are parsed before display is initialized, so redo switch */
    switch_graphics(settings.graphics);
}